

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UT_OK.cpp
# Opt level: O2

void __thiscall copy_no_default5::test_method(copy_no_default5 *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> left_begin;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  equal_coll_impl local_201;
  assertion_result local_200;
  int a;
  vector<int,_std::allocator<int>_> v;
  undefined **local_1c8;
  ulong uStack_1c0;
  undefined8 *local_1b8;
  char *local_1b0;
  vector<int,_std::allocator<int>_> b;
  vector<int,_std::allocator<int>_> x;
  vector<int,_std::allocator<int>_> e;
  double d;
  char *c;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_1c8 = (undefined **)0x200000001;
  uStack_1c0 = 0x400000003;
  local_1b8._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_1c8;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&local_200);
  local_1c8 = (undefined **)0xc0000000b;
  uStack_1c0 = 0xe0000000d;
  local_1b8 = (undefined8 *)CONCAT44(local_1b8._4_4_,0xf);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_1c8;
  std::vector<int,_std::allocator<int>_>::vector(&x,__l_00,(allocator_type *)&local_200);
  a = 0x2a;
  std::vector<int,_std::allocator<int>_>::vector(&b,&v);
  c = "foo";
  d = 12.5;
  std::vector<int,_std::allocator<int>_>::vector(&e,&x);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x85);
  uStack_1c0 = uStack_1c0 & 0xffffffffffffff00;
  local_1c8 = &PTR__lazy_ostream_00115a38;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_58 = "";
  local_200._0_4_ = 0x2a;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_1c8,&local_60,0x85,1,2,&a,"a",&local_200,"42");
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x88);
  left_begin._M_current._4_4_ =
       b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
       _4_4_;
  left_begin._M_current._0_4_ =
       b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
       _0_4_;
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_200,(equal_coll_impl *)&local_150,left_begin,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uStack_1c0 = uStack_1c0 & 0xffffffffffffff00;
  local_1c8 = &PTR__lazy_ostream_00115a38;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_200,&local_1c8,&local_90,0x88,1,0xd,4,"std::begin(b)","std::end(b)",
             "std::begin(v)","std::end(v)");
  boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_148 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x89);
  uStack_1c0 = uStack_1c0 & 0xffffffffffffff00;
  local_1c8 = &PTR__lazy_ostream_00115a38;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_a8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[4]>
            (&local_1c8,&local_b0,0x89,1,2,&c,"c","foo","\"foo\"");
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x8a);
  uStack_1c0 = uStack_1c0 & 0xffffffffffffff00;
  local_1c8 = &PTR__lazy_ostream_00115a38;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_d8 = "";
  local_200.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_200._1_7_ = 0x40290000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1c8,&local_e0,0x8a,1,2,&d,"d",&local_200,"12.5");
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x8d);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_200,&local_201,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uStack_1c0 = uStack_1c0 & 0xffffffffffffff00;
  local_1c8 = &PTR__lazy_ostream_00115a38;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_108 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_200,&local_1c8,&local_110,0x8d,1,0xd,4,"std::begin(e)","std::end(e)",
             "std::begin(x)","std::end(x)");
  boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
  local_1c8._0_4_ = 0x2a;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&b,(int *)&local_1c8);
  local_1c8 = (undefined **)CONCAT44(local_1c8._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&e,(int *)&local_1c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&e.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&b.super__Vector_base<int,_std::allocator<int>_>);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x95);
  uStack_1c0 = uStack_1c0 & 0xffffffffffffff00;
  local_1c8 = &PTR__lazy_ostream_00115a38;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_138 = "";
  local_200._0_8_ =
       (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ = 5
  ;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_1c8,&local_140,0x95,1,2,&local_200,"v.size()",
             &b.super__Vector_base<int,_std::allocator<int>_>,"5");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&x.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(copy_no_default5)
{
    auto       v = std::vector<int>{ 1, 2, 3, 4, 5};
    auto const x = std::vector<int>{ 11, 12, 13, 14, 15};
    f_copy_no_default5(
            [&](auto&& a, auto&& b, auto&& c, auto&& d, auto&& e) {
            BOOST_CHECK_EQUAL(a, 42);
            BOOST_CHECK_EQUAL_COLLECTIONS(
                    std::begin(b), std::end(b),
                    std::begin(v), std::end(v));
            BOOST_CHECK_EQUAL(c, "foo");
            BOOST_CHECK_EQUAL(d, 12.5);
            BOOST_CHECK_EQUAL_COLLECTIONS(
                    std::begin(e), std::end(e),
                    std::begin(x), std::end(x));
            },
            "a"_na=42,
            "b"_na=v,
            "c"_na="foo",
            "d"_na=12.5,
            "e"_na=x
            );
    BOOST_CHECK_EQUAL(v.size(), 5); // check v was copied
}